

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol,int start,int incr)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  undefined8 *puVar8;
  DataKey DVar9;
  int iVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *tol;
  long lVar12;
  long lVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_18c;
  cpp_dec_float<50U,_int,_void> local_178;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_140;
  cpp_dec_float<50U,_int,_void> *local_138;
  pointer local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  devexpr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  DVar9.info = 0;
  DVar9.idx = -1;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  local_130 = (pSVar2->coWeights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  iVar10 = (int)((long)(pSVar2->coWeights).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)local_130 >> 3) *
           -0x49249249;
  if (start < iVar10) {
    pnVar3 = (pSVar2->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f0 = &this->last;
    lVar13 = (long)start;
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)(long)incr;
    lVar12 = lVar13 * 0x38 + 0x30;
    local_18c = -1;
    local_140 = this;
    local_138 = &best->m_backend;
    do {
      local_178.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar12 + -0x10);
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar12 + -0x30);
      local_178.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_178.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar12 + -0x20);
      local_178.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_178.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_178.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar12 + -8);
      local_178.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar12 + -4);
      local_178._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar12);
      local_128.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_128.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_128.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_128.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_128.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_128.exp = (feastol->m_backend).exp;
      local_128.neg = (feastol->m_backend).neg;
      local_128.fpclass = (feastol->m_backend).fpclass;
      local_128.prec_elem = (feastol->m_backend).prec_elem;
      if (local_128.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite) {
        local_128.neg = (bool)(local_128.neg ^ 1);
      }
      if ((local_178.fpclass != cpp_dec_float_NaN && local_128.fpclass != cpp_dec_float_NaN) &&
         (tol = pnVar11,
         iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_178,&local_128), iVar7 < 0)) {
        local_68 = (devexpr  [8])local_178.data._M_elems._0_8_;
        auStack_60[0] = local_178.data._M_elems[2];
        auStack_60[1] = local_178.data._M_elems[3];
        local_58[0] = local_178.data._M_elems[4];
        local_58[1] = local_178.data._M_elems[5];
        auStack_50[0] = local_178.data._M_elems[6];
        auStack_50[1] = local_178.data._M_elems[7];
        local_48[0] = local_178.data._M_elems[8];
        local_48[1] = local_178.data._M_elems[9];
        local_40 = local_178.exp;
        local_3c = local_178.neg;
        local_38 = local_178.fpclass;
        iStack_34 = local_178.prec_elem;
        puVar1 = (uint *)((long)&(local_130->m_backend).data + lVar12 + -0x30);
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(local_130->m_backend).data + lVar12 + -0x20);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(local_130->m_backend).data + lVar12 + -0x10);
        local_a8.m_backend.exp = *(int *)((long)&(local_130->m_backend).data + lVar12 + -8);
        local_a8.m_backend.neg = *(bool *)((long)&(local_130->m_backend).data + lVar12 + -4);
        local_a8.m_backend._48_8_ = *(undefined8 *)((long)&(local_130->m_backend).data + lVar12);
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (feastol->m_backend).exp;
        local_e8.m_backend.neg = (feastol->m_backend).neg;
        local_e8.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_128,local_68,&local_a8,&local_e8,tol);
        local_178.data._M_elems[8] = local_128.data._M_elems[8];
        local_178.data._M_elems[9] = local_128.data._M_elems[9];
        local_178.data._M_elems[4] = local_128.data._M_elems[4];
        local_178.data._M_elems[5] = local_128.data._M_elems[5];
        local_178.data._M_elems[6] = local_128.data._M_elems[6];
        local_178.data._M_elems[7] = local_128.data._M_elems[7];
        local_178.data._M_elems[0] = local_128.data._M_elems[0];
        local_178.data._M_elems[1] = local_128.data._M_elems[1];
        local_178.data._M_elems[2] = local_128.data._M_elems[2];
        local_178.data._M_elems[3] = local_128.data._M_elems[3];
        local_178.exp = local_128.exp;
        local_178.neg = local_128.neg;
        local_178.fpclass = local_128.fpclass;
        local_178.prec_elem = local_128.prec_elem;
        if ((local_128.fpclass != cpp_dec_float_NaN) &&
           ((local_138->fpclass != cpp_dec_float_NaN &&
            (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_178,local_138), 0 < iVar7)))) {
          puVar8 = (undefined8 *)((long)&(local_130->m_backend).data + lVar12);
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 8)
               = local_178.data._M_elems._32_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 4)
               = local_178.data._M_elems._16_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 6)
               = local_178.data._M_elems._24_8_;
          *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems =
               local_178.data._M_elems._0_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 2)
               = local_178.data._M_elems._8_8_;
          local_138->exp = local_178.exp;
          local_138->neg = local_178.neg;
          local_138->fpclass = local_178.fpclass;
          local_138->prec_elem = local_178.prec_elem;
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 8) = puVar8[-2];
          uVar4 = puVar8[-6];
          uVar5 = puVar8[-5];
          uVar6 = puVar8[-3];
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 4) = puVar8[-4];
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 6) = uVar6;
          *(undefined8 *)(local_f0->m_backend).data._M_elems = uVar4;
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 2) = uVar5;
          (local_140->last).m_backend.exp = *(int *)(puVar8 + -1);
          (local_140->last).m_backend.neg = *(bool *)((long)puVar8 + -4);
          uVar4 = *puVar8;
          (local_140->last).m_backend.fpclass = (int)uVar4;
          (local_140->last).m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
          local_18c = (int)lVar13;
        }
      }
      lVar13 = (long)(pnVar11->m_backend).data._M_elems + lVar13;
      lVar12 = lVar12 + (long)pnVar11 * 0x38;
    } while (lVar13 < iVar10);
    DVar9.info = 0;
    DVar9.idx = -1;
    if (-1 < local_18c) {
      DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::coId((local_140->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver,local_18c);
    }
  }
  return (SPxId)DVar9;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseDim(R& best, R feastol, int start, int incr)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   int end = this->thesolver->coWeights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->coTest().dim());

   for(; start < end; start += incr)
   {
      x = cTest[start];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = cpen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);

   return SPxId();
}